

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O0

void Llb_ImgQuantifyFirst(Aig_Man_t *pAig,Vec_Ptr_t *vDdMans,Vec_Ptr_t *vQuant0,int fVerbose)

{
  DdNode *node;
  int iVar1;
  uint uVar2;
  abctime aVar3;
  DdManager *unique;
  Vec_Int_t *vNodeIds;
  DdNode *n;
  DdNode *n_00;
  abctime aVar4;
  abctime clk;
  int i;
  DdNode *bTemp;
  DdNode *bRes;
  DdNode *bProd;
  DdManager *dd;
  int fVerbose_local;
  Vec_Ptr_t *vQuant0_local;
  Vec_Ptr_t *vDdMans_local;
  Aig_Man_t *pAig_local;
  
  aVar3 = Abc_Clock();
  clk._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vDdMans);
    if (iVar1 <= (int)clk._4_4_) {
      return;
    }
    unique = (DdManager *)Vec_PtrEntry(vDdMans,clk._4_4_);
    if (unique->bFunc2 != (DdNode *)0x0) break;
    unique->bFunc2 = unique->bFunc;
    Cudd_Ref(unique->bFunc2);
    Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
    node = unique->bFunc;
    if (fVerbose != 0) {
      uVar2 = Cudd_DagSize(node);
      Abc_Print(1,"Part %2d : Init =%5d. ",(ulong)clk._4_4_,(ulong)uVar2);
    }
    vNodeIds = (Vec_Int_t *)Vec_PtrEntry(vQuant0,clk._4_4_ + 1);
    n = Llb_ImgComputeCube(pAig,vNodeIds,unique);
    Cudd_Ref(n);
    n_00 = Cudd_bddExistAbstract(unique,node,n);
    Cudd_Ref(n_00);
    Cudd_RecursiveDeref(unique,node);
    Cudd_RecursiveDeref(unique,n);
    unique->bFunc = n_00;
    Cudd_AutodynDisable(unique);
    if (fVerbose != 0) {
      uVar2 = Cudd_DagSize(n_00);
      Abc_Print(1,"Quant =%5d. ",(ulong)uVar2);
    }
    Cudd_ReduceHeap(unique,CUDD_REORDER_SYMM_SIFT,100);
    if (fVerbose != 0) {
      uVar2 = Cudd_DagSize(n_00);
      Abc_Print(1,"Reo = %5d. ",(ulong)uVar2);
    }
    Cudd_ReduceHeap(unique,CUDD_REORDER_SYMM_SIFT,100);
    if (fVerbose != 0) {
      uVar2 = Cudd_DagSize(n_00);
      Abc_Print(1,"Reo = %5d.  ",(ulong)uVar2);
      uVar2 = Cudd_SupportSize(unique,n_00);
      Abc_Print(1,"Supp = %3d.  ",(ulong)uVar2);
      aVar4 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar4 - aVar3);
    }
    clk._4_4_ = clk._4_4_ + 1;
  }
  __assert_fail("dd->bFunc2 == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/llb/llb2Image.c"
                ,0x129,"void Llb_ImgQuantifyFirst(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, int)");
}

Assistant:

void Llb_ImgQuantifyFirst( Aig_Man_t * pAig, Vec_Ptr_t * vDdMans, Vec_Ptr_t * vQuant0, int fVerbose )
{
    DdManager * dd;
    DdNode * bProd, * bRes, * bTemp;
    int i;
    abctime clk = Abc_Clock();
    Vec_PtrForEachEntry( DdManager *, vDdMans, dd, i )
    {
        // remember unquantified ones
        assert( dd->bFunc2 == NULL );
        dd->bFunc2 = dd->bFunc;   Cudd_Ref( dd->bFunc2 );

        Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );

        bRes = dd->bFunc;
        if ( fVerbose )
            Abc_Print( 1, "Part %2d : Init =%5d. ", i, Cudd_DagSize(bRes) );
        bProd = Llb_ImgComputeCube( pAig, (Vec_Int_t *)Vec_PtrEntry(vQuant0, i+1), dd );   Cudd_Ref( bProd );
        bRes  = Cudd_bddExistAbstract( dd, bTemp = bRes, bProd );                          Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bProd );
        dd->bFunc = bRes;

        Cudd_AutodynDisable( dd );

        if ( fVerbose )
            Abc_Print( 1, "Quant =%5d. ", Cudd_DagSize(bRes) );
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
        if ( fVerbose ) 
            Abc_Print( 1, "Reo = %5d. ", Cudd_DagSize(bRes) );
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
        if ( fVerbose ) 
            Abc_Print( 1, "Reo = %5d.  ", Cudd_DagSize(bRes) );
        if ( fVerbose ) 
            Abc_Print( 1, "Supp = %3d.  ", Cudd_SupportSize(dd, bRes) );
        if ( fVerbose ) 
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    }
}